

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O3

int main(void)

{
  NodePtr pNVar1;
  pointer pNVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer pNVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *member;
  bool bVar7;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  family;
  long *local_128;
  long local_120;
  long local_118 [2];
  long *local_108;
  long local_100;
  long local_f8 [2];
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50 [2];
  pointer local_40;
  pointer local_38;
  
  pNVar1 = (NodePtr)operator_new(0x40);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"me","");
  pNVar2 = (pointer)operator_new(0x40);
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"mother","");
  pNVar3 = (pointer)operator_new(0x40);
  local_80 = local_70;
  local_38 = pNVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"mother\'s mother","");
  (pNVar3->value)._M_dataplus._M_p = (pointer)&(pNVar3->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar3,local_80,local_78 + (long)local_80);
  pNVar3->left = (pointer)0x0;
  pNVar3->right = (pointer)0x0;
  pNVar4 = (pointer)operator_new(0x40);
  local_a0 = local_90;
  local_40 = pNVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"mother\'s father","");
  (pNVar4->value)._M_dataplus._M_p = (pointer)&(pNVar4->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar4,local_a0,local_98 + (long)local_a0);
  pNVar4->left = (pointer)0x0;
  pNVar4->right = (pointer)0x0;
  (pNVar2->value)._M_dataplus._M_p = (pointer)&(pNVar2->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar2,local_108,local_100 + (long)local_108);
  pNVar2->left = pNVar3;
  pNVar2->right = pNVar4;
  pNVar3->parent = pNVar2;
  pNVar4->parent = pNVar2;
  pNVar3 = (pointer)operator_new(0x40);
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"father","");
  pNVar4 = (pointer)operator_new(0x40);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"father\'s mother","");
  (pNVar4->value)._M_dataplus._M_p = (pointer)&(pNVar4->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar4,local_c0,local_b8 + (long)local_c0);
  pNVar4->left = (pointer)0x0;
  pNVar4->right = (pointer)0x0;
  pNVar5 = (pointer)operator_new(0x40);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"father\'s father","");
  (pNVar5->value)._M_dataplus._M_p = (pointer)&(pNVar5->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar5,local_e0,local_d8 + (long)local_e0);
  pNVar5->left = (pointer)0x0;
  pNVar5->right = (pointer)0x0;
  (pNVar3->value)._M_dataplus._M_p = (pointer)&(pNVar3->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar3,local_128,local_120 + (long)local_128);
  pNVar3->left = pNVar4;
  pNVar3->right = pNVar5;
  pNVar4->parent = pNVar3;
  pNVar5->parent = pNVar3;
  (pNVar1->value)._M_dataplus._M_p = (pointer)&(pNVar1->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pNVar1,local_60,local_58 + (long)local_60);
  pNVar1->left = pNVar2;
  pNVar1->right = pNVar3;
  pNVar2->parent = pNVar1;
  pNVar3->parent = pNVar1;
  local_e8.root = pNVar1;
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  do {
    pNVar2 = pNVar1;
    pNVar1 = pNVar2->left;
  } while (pNVar2->left != (pointer)0x0);
  do {
    while( true ) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pNVar2->value)._M_dataplus._M_p,
                          (pNVar2->value)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pNVar3 = pNVar2->right;
      pNVar1 = pNVar2;
      if (pNVar2->right == (pointer)0x0) break;
      do {
        pNVar2 = pNVar3;
        pNVar3 = pNVar2->left;
      } while (pNVar2->left != (pointer)0x0);
    }
    do {
      pNVar2 = pNVar1->parent;
      if (pNVar2 == (pointer)0x0) {
        BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~BinaryTree(&local_e8);
        return 0;
      }
      bVar7 = pNVar1 == pNVar2->right;
      pNVar1 = pNVar2;
    } while (bVar7);
  } while( true );
}

Assistant:

int main()
{
	BinaryTree<std::string> family{
		new Node<std::string>{"me",
			new Node<std::string>{"mother",
				new Node<std::string>{"mother's mother"},
				new Node<std::string>{"mother's father"}
			},
			new Node<std::string>{"father",
				new Node<std::string>{"father's mother"},
				new Node<std::string>{"father's father"}
			}
		}
	};


	for(const auto& member : family)
	{
		std::cout << member << std::endl;
	}

	return 0;
}